

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_22::Unsubtyping::optimizeTypes(Unsubtyping *this,Module *wasm)

{
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_a8;
  Rewriter local_88;
  Module *local_18;
  Module *wasm_local;
  Unsubtyping *this_local;
  
  local_18 = wasm;
  wasm_local = (Module *)this;
  wasm::(anonymous_namespace)::Unsubtyping::optimizeTypes(wasm::Module&)::Rewriter::Rewriter(wasm::
  (anonymous_namespace)::Unsubtyping&,wasm::Module__(&local_88,this,wasm);
  local_a8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_a8);
  GlobalTypeRewriter::update(&local_88.super_GlobalTypeRewriter,&local_a8);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_a8);
  optimizeTypes::Rewriter::~Rewriter(&local_88);
  return;
}

Assistant:

void optimizeTypes(Module& wasm) {
    struct Rewriter : GlobalTypeRewriter {
      Unsubtyping& parent;
      Rewriter(Unsubtyping& parent, Module& wasm)
        : GlobalTypeRewriter(wasm), parent(parent) {}
      std::optional<HeapType> getDeclaredSuperType(HeapType type) override {
        if (auto it = parent.supertypes.find(type);
            it != parent.supertypes.end() && !it->second.isBasic()) {
          return it->second;
        }
        return std::nullopt;
      }
    };
    Rewriter(*this, wasm).update();
  }